

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassicSudokuVisualizer.cpp
# Opt level: O0

ClassicSudokuVisualizer * __thiscall
ClassicSudokuVisualizer::createCells_abi_cxx11_(ClassicSudokuVisualizer *this)

{
  cell cVar1;
  SudokuGitter *in_RSI;
  __cxx11 local_a8 [32];
  __cxx11 local_88 [32];
  __cxx11 local_68 [36];
  uint local_44;
  undefined1 local_40;
  uint local_3c;
  uint local_38;
  uint num;
  uint col;
  uint row;
  uint counter;
  allocator local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint size;
  ClassicSudokuVisualizer *this_local;
  string *cells;
  
  this_local = this;
  local_1c = SudokuGitter::getElements(in_RSI);
  local_1d = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  col = 0;
  for (num = 0; num < local_1c; num = num + 1) {
    std::__cxx11::string::append((char *)this);
    for (local_38 = 0; local_38 < local_1c; local_38 = local_38 + 1) {
      cVar1 = SudokuGitter::getCell(in_RSI,num,local_38);
      local_44 = cVar1.value;
      local_40 = cVar1.isStatic;
      local_3c = local_44;
      if (local_44 == 0) {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_a8,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_a8);
        std::__cxx11::string::append((char *)this);
      }
      else {
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_68,col);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_68);
        std::__cxx11::string::append((char *)this);
        std::__cxx11::to_string(local_88,local_3c);
        std::__cxx11::string::append((string *)this);
        std::__cxx11::string::~string((string *)local_88);
        std::__cxx11::string::append((char *)this);
      }
      col = col + 1;
    }
    std::__cxx11::string::append((char *)this);
  }
  return this;
}

Assistant:

const std::string ClassicSudokuVisualizer::createCells() {
    unsigned int size = gitter.getElements();

    std::string cells = "";

    unsigned int counter = 0;
    for (unsigned int row = 0; row < size; row++) {
        cells.append("<tr>");
        for (unsigned int col = 0; col < size; col++) {
            unsigned int num = gitter.getCell(row, col).value;
            if (num > 0) {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text' value='");
                cells.append(std::to_string(num));
                cells.append("' disabled></td>");
            } else {
                cells.append("<td><input id='cell-");
                cells.append(std::to_string(counter));
                cells.append("' type='text'></td>");
            }
            counter++;
        }
        cells.append("</tr>");
    }

    return cells;
}